

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-select.cc
# Opt level: O2

void __thiscall
dynet::PickElement::backward_dev_impl<dynet::Device_CPU>
          (PickElement *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  invalid_argument *this_00;
  uint uVar1;
  ulong uVar2;
  DefaultDevice *local_238;
  TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
  *local_230;
  undefined1 local_228 [56];
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_1f0;
  TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer> local_1d0;
  ostringstream oss;
  DimensionId<_1L> local_178;
  ulong local_170;
  DimensionId<_1L> local_168 [39];
  
  if (i == 0) {
    if (this->pval == (uint *)0x0) {
      for (uVar1 = 0; uVar2 = (ulong)uVar1,
          uVar2 < (ulong)((long)(this->pvals->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pvals->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start >> 2); uVar1 = uVar1 + 1) {
        if (((*(xs->
               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->d).bd == 1) {
          Tensor::tb<2>((TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *)
                        &local_1d0,dEdf);
          _oss = local_1d0.m_data;
          Tensor::t<3>(&local_1f0,dEdxi);
          local_228._32_8_ =
               ZEXT48((this->pvals->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                      ._M_impl.super__Vector_impl_data._M_start[uVar2]);
          local_228._16_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[1];
          local_228._24_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[2];
          local_228._0_8_ = local_1f0.m_data;
          local_228._8_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[0];
          Eigen::internal::DimensionId<-1L>::DimensionId
                    ((DimensionId<_1L> *)(local_228 + 0x28),(ulong)this->dimension);
          local_238 = dev->edevice;
          local_230 = (TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
                       *)local_228;
          Eigen::
          TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
          ::operator+=((TensorDevice<Eigen::TensorChippingOp<_1l,Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                        *)&local_238,
                       (TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
                        *)&oss);
        }
        else {
          Tensor::tb<2>(&local_1f0,dEdf);
          local_228._16_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[1];
          local_228._24_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[2];
          local_228._0_8_ = local_1f0.m_data;
          local_228._8_8_ = local_1f0.m_dimensions.super_array<long,_3>._M_elems[0];
          local_228._32_8_ = uVar2;
          Tensor::tb<3>(&local_1d0,dEdxi);
          local_170 = (ulong)(this->pvals->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar2];
          _oss = local_1d0.m_data;
          Eigen::internal::DimensionId<-1L>::DimensionId(local_168,(ulong)this->dimension);
          local_238 = dev->edevice;
          local_230 = (TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
                       *)&oss;
          Eigen::
          TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorChippingOp<3l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
          ::operator+=((TensorDevice<Eigen::TensorChippingOp<_1l,Eigen::TensorChippingOp<3l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>>,Eigen::DefaultDevice>
                        *)&local_238,
                       (TensorChippingOp<2L,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
                        *)local_228);
        }
      }
    }
    else {
      Tensor::tb<2>((TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *)&local_1d0
                    ,dEdf);
      Tensor::tb<3>((TensorMap<Eigen::Tensor<float,_4,_0,_long>,_0,_Eigen::MakePointer> *)local_228,
                    dEdxi);
      _oss = (StoragePointerType)local_228._0_8_;
      Eigen::internal::DimensionId<-1L>::DimensionId(&local_178,(ulong)this->dimension);
      local_1f0.m_data = (StoragePointerType)dev->edevice;
      local_1f0.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&oss;
      Eigen::
      TensorDevice<Eigen::TensorChippingOp<-1l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorChippingOp<_1l,Eigen::TensorMap<Eigen::Tensor<float,4,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                    *)&local_1f0,
                   (TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *)&local_1d0)
      ;
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,"Failed dimension check in PickElement::backward");
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,(string *)local_228);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void PickElement::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  DYNET_ARG_CHECK(i == 0, "Failed dimension check in PickElement::backward");
  if(pval) {
    dEdxi.tb<3>().chip(*pval, dimension).device(*dev.edevice) += dEdf.tb<2>();
  } else {
    DYNET_ASSERT(pvals, "Neither single nor vector of elements available in PickElement::forward");
    for(unsigned b = 0; b < pvals->size(); ++b){
      if(xs[0]->d.bd == 1){
        dEdxi.t<3>().chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }else{
        dEdxi.tb<3>().chip<3>(b).chip((*pvals)[b], dimension).device(*dev.edevice) += dEdf.tb<2>().chip<2>(b);
      }
    }
  }
}